

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_tcplisten.c
# Opt level: O0

void tcp_listener_accept(void *arg,nni_aio *aio)

{
  _Bool _Var1;
  nni_aio *pnVar2;
  tcp_listener *l;
  nni_aio *aio_local;
  void *arg_local;
  
  nni_aio_reset(aio);
  nni_mtx_lock((nni_mtx *)((long)arg + 0x130));
  if ((*(byte *)((long)arg + 0x128) & 1) == 0) {
    nni_mtx_unlock((nni_mtx *)((long)arg + 0x130));
    nni_aio_finish_error(aio,NNG_ESTATE);
  }
  else if ((*(byte *)((long)arg + 0x129) & 1) == 0) {
    _Var1 = nni_aio_start(aio,tcp_listener_cancel,arg);
    if (_Var1) {
      nni_aio_list_append((nni_list *)((long)arg + 0x110),aio);
      pnVar2 = (nni_aio *)nni_list_first((nni_list *)((long)arg + 0x110));
      if (pnVar2 == aio) {
        tcp_listener_doaccept((tcp_listener *)arg);
      }
      nni_mtx_unlock((nni_mtx *)((long)arg + 0x130));
    }
    else {
      nni_mtx_unlock((nni_mtx *)((long)arg + 0x130));
    }
  }
  else {
    nni_mtx_unlock((nni_mtx *)((long)arg + 0x130));
    nni_aio_finish_error(aio,NNG_ECLOSED);
  }
  return;
}

Assistant:

static void
tcp_listener_accept(void *arg, nni_aio *aio)
{
	tcp_listener *l = arg;

	// Accept is simpler than the connect case.  With accept we just
	// need to wait for the socket to be readable to indicate an incoming
	// connection is ready for us.  There isn't anything else for us to
	// do really, as that will have been done in listen.
	nni_aio_reset(aio);
	nni_mtx_lock(&l->mtx);

	if (!l->started) {
		nni_mtx_unlock(&l->mtx);
		nni_aio_finish_error(aio, NNG_ESTATE);
		return;
	}
	if (l->closed) {
		nni_mtx_unlock(&l->mtx);
		nni_aio_finish_error(aio, NNG_ECLOSED);
		return;
	}
	if (!nni_aio_start(aio, tcp_listener_cancel, l)) {
		nni_mtx_unlock(&l->mtx);
		return;
	}
	nni_aio_list_append(&l->acceptq, aio);
	if (nni_list_first(&l->acceptq) == aio) {
		tcp_listener_doaccept(l);
	}
	nni_mtx_unlock(&l->mtx);
}